

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createSCmpNE(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  BasicBlock *pBVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  string local_80;
  Value *local_60;
  Value *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_60 = rhs;
  local_58 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x19f,
                  "Value *flow::IRBuilder::createSCmpNE(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == String) {
    if (lhs == (Value *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(lhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    }
    if (lVar3 == 0) {
      bVar4 = true;
    }
    else {
      if (rhs == (Value *)0x0) {
        rhs = (Value *)0x0;
      }
      else {
        rhs = (Value *)__dynamic_cast(rhs,&Value::typeinfo,
                                      &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                       typeinfo,0);
      }
      bVar4 = (BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)rhs ==
              (BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)0x0;
      if (!bVar4) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,*(long *)(lVar3 + 0x48),
                   *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
        pBVar1 = (((BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)rhs)->super_Instr)
                 .basicBlock_;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pBVar1,
                   (long)&(pBVar1->super_Value)._vptr_Value +
                   (long)(((BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)rhs)->
                         super_Instr).operands_.
                         super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                         super__Vector_impl_data._M_start);
        lVar3 = 0x18;
        if (local_80._M_string_length == local_48) {
          if (local_80._M_string_length == 0) {
            lVar3 = 0x68;
          }
          else {
            iVar2 = bcmp(local_80._M_dataplus._M_p,local_50,local_80._M_string_length);
            lVar3 = 0x18;
            if (iVar2 == 0) {
              lVar3 = 0x68;
            }
          }
        }
        rhs = (Value *)((long)&(this->program_->modules_).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (bVar4) {
      makeName(&local_80,this,name);
      rhs = (Value *)insert<flow::BinaryInstr<(flow::BinaryOperator)23,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                               (this,&local_58,&local_60,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    return (Value *)(BinaryInstr<(flow::BinaryOperator)23,_(flow::LiteralType)1> *)rhs;
  }
  __assert_fail("lhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x1a0,"Value *flow::IRBuilder::createSCmpNE(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createSCmpNE(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() != b->get());

  return insert<SCmpNEInstr>(lhs, rhs, makeName(name));
}